

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_test.cc
# Opt level: O0

void __thiscall
visitor_test_should_parse_utc_timestamp_with_milliseconds_Test::TestBody
          (visitor_test_should_parse_utc_timestamp_with_milliseconds_Test *this)

{
  bool bVar1;
  size_t size;
  char *pcVar2;
  int *lhs;
  AssertHelper local_1e0;
  Message local_1d8;
  bool local_1cd;
  _Optional_payload_base<int> local_1cc;
  bool local_1c1;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_7;
  Message local_1a8;
  int local_19c;
  _Optional_payload_base<int> local_198;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_6;
  Message local_178;
  int local_16c;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_5;
  Message local_150;
  int local_144;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_4;
  Message local_128;
  int local_11c;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_3;
  Message local_100;
  int local_f4;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_2;
  Message local_d8;
  int local_cc;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_b0;
  Message local_a8 [3];
  int local_8c;
  undefined1 local_88 [8];
  AssertionResult gtest_ar;
  tm tm;
  time_t local_38;
  time_t t;
  Time time;
  char *str;
  visitor_test_should_parse_utc_timestamp_with_milliseconds_Test *this_local;
  
  time.m_usec.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int> =
       (_Optional_base<int,_true,_true>)anon_var_dwarf_55e36;
  size = strlen("20171105-14:09:30.125");
  pcVar2 = "20171105-14:09:30.125";
  Fixpp::details::LexicalCast<Fixpp::Type::UTCTimestamp>::cast
            ((Time *)&t,"20171105-14:09:30.125",size);
  local_38 = Fixpp::Type::UTCTimestamp::Time::time((Time *)&t,(time_t *)pcVar2);
  tm.tm_wday = 0;
  tm.tm_yday = 0;
  tm.tm_isdst = 0;
  tm._36_4_ = 0;
  tm.tm_hour = 0;
  tm.tm_mday = 0;
  tm.tm_mon = 0;
  tm.tm_year = 0;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  tm.tm_sec = 0;
  tm.tm_min = 0;
  tm.tm_gmtoff = 0;
  gmtime_r(&local_38,(tm *)&gtest_ar.message_);
  local_8c = 0x75;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_88,"tm.tm_year","117",&tm.tm_mday,&local_8c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(local_a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
               ,0x29f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b0,local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    testing::Message::~Message(local_a8);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    local_cc = 10;
    testing::internal::EqHelper<false>::Compare<int,int>
              ((EqHelper<false> *)local_c8,"tm.tm_mon","10",&tm.tm_hour,&local_cc);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
    if (!bVar1) {
      testing::Message::Message(&local_d8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                 ,0x2a0,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_d8);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      local_f4 = 5;
      testing::internal::EqHelper<false>::Compare<int,int>
                ((EqHelper<false> *)local_f0,"tm.tm_mday","5",&tm.tm_min,&local_f4);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
      if (!bVar1) {
        testing::Message::Message(&local_100);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                   ,0x2a1,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_100);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_100);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
        local_11c = 0xe;
        testing::internal::EqHelper<false>::Compare<int,int>
                  ((EqHelper<false> *)local_118,"tm.tm_hour","14",&tm.tm_sec,&local_11c);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
        if (!bVar1) {
          testing::Message::Message(&local_128);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                     ,0x2a2,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_4.message_,&local_128);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
          testing::Message::~Message(&local_128);
        }
        gtest_ar_1.message_.ptr_._5_3_ = 0;
        gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
        if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
          local_144 = 9;
          testing::internal::EqHelper<false>::Compare<int,int>
                    ((EqHelper<false> *)local_140,"tm.tm_min","9",
                     (int *)((long)&gtest_ar.message_.ptr_ + 4),&local_144);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
          if (!bVar1) {
            testing::Message::Message(&local_150);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                       ,0x2a3,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_5.message_,&local_150);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
            testing::Message::~Message(&local_150);
          }
          gtest_ar_1.message_.ptr_._5_3_ = 0;
          gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
          if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
            local_16c = 0x1e;
            testing::internal::EqHelper<false>::Compare<int,int>
                      ((EqHelper<false> *)local_168,"tm.tm_sec","30",(int *)&gtest_ar.message_,
                       &local_16c);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
            if (!bVar1) {
              testing::Message::Message(&local_178);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_6.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                         ,0x2a4,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_6.message_,&local_178);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
              testing::Message::~Message(&local_178);
            }
            gtest_ar_1.message_.ptr_._5_3_ = 0;
            gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
            if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
              local_198 = (_Optional_payload_base<int>)
                          Fixpp::Type::UTCTimestamp::Time::msec((Time *)&t);
              lhs = std::optional<int>::value((optional<int> *)&local_198);
              local_19c = 0x7d;
              testing::internal::EqHelper<false>::Compare<int,int>
                        ((EqHelper<false> *)local_190,"time.msec().value()","125",lhs,&local_19c);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
              if (!bVar1) {
                testing::Message::Message(&local_1a8);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_7.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                           ,0x2a6,pcVar2);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_7.message_,&local_1a8);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_)
                ;
                testing::Message::~Message(&local_1a8);
              }
              gtest_ar_1.message_.ptr_._5_3_ = 0;
              gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
              if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                local_1cc = (_Optional_payload_base<int>)
                            Fixpp::Type::UTCTimestamp::Time::usec((Time *)&t);
                local_1c1 = std::optional<int>::has_value((optional<int> *)&local_1cc);
                local_1cd = false;
                testing::internal::EqHelper<false>::Compare<bool,bool>
                          ((EqHelper<false> *)local_1c0,"time.usec().has_value()","false",&local_1c1
                           ,&local_1cd);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_1c0);
                if (!bVar1) {
                  testing::Message::Message(&local_1d8);
                  pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_1e0,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                             ,0x2a7,pcVar2);
                  testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
                  testing::internal::AssertHelper::~AssertHelper(&local_1e0);
                  testing::Message::~Message(&local_1d8);
                }
                gtest_ar_1.message_.ptr_._5_3_ = 0;
                gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST(visitor_test, should_parse_utc_timestamp_with_milliseconds)
{
    const char* str = "20171105-14:09:30.125";
    auto time = Fixpp::details::LexicalCast<Fixpp::Type::UTCTimestamp>::cast(str, std::strlen(str));

    auto t = time.time();
    std::tm tm{};
    gmtime_r(&t, &tm);

    ASSERT_EQ(tm.tm_year, 117);
    ASSERT_EQ(tm.tm_mon, 10);
    ASSERT_EQ(tm.tm_mday, 5);
    ASSERT_EQ(tm.tm_hour, 14);
    ASSERT_EQ(tm.tm_min, 9);
    ASSERT_EQ(tm.tm_sec, 30);

    ASSERT_EQ(time.msec().value(), 125);
    ASSERT_EQ(time.usec().has_value(), false);
}